

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

void __thiscall
phmap::priv::
parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
::swap<phmap::NullMutex>
          (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
           *this,parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
                 *that)

{
  long lVar1;
  undefined8 uVar2;
  int iVar3;
  long lVar4;
  
  lVar4 = 0x28;
  do {
    iVar3 = pthread_mutex_lock((pthread_mutex_t *)this);
    if (iVar3 != 0) {
      std::__throw_system_error(iVar3);
    }
    lVar1 = ((pthread_mutex_t *)((long)this + 0x28))->__align;
    ((pthread_mutex_t *)((long)this + 0x28))->__align =
         *(long *)((long)(that->sets_)._M_elems + lVar4 + -0x28);
    *(long *)((long)(that->sets_)._M_elems + lVar4 + -0x28) = lVar1;
    uVar2 = *(undefined8 *)((long)this + 0x30);
    *(undefined8 *)((long)this + 0x30) =
         *(undefined8 *)((long)(that->sets_)._M_elems + lVar4 + -0x20);
    *(undefined8 *)((long)(that->sets_)._M_elems + lVar4 + -0x20) = uVar2;
    uVar2 = *(undefined8 *)((long)this + 0x38);
    *(undefined8 *)((long)this + 0x38) =
         *(undefined8 *)((long)(that->sets_)._M_elems + lVar4 + -0x18);
    *(undefined8 *)((long)(that->sets_)._M_elems + lVar4 + -0x18) = uVar2;
    uVar2 = *(undefined8 *)((long)this + 0x40);
    *(undefined8 *)((long)this + 0x40) =
         *(undefined8 *)((long)(that->sets_)._M_elems + lVar4 + -0x10);
    *(undefined8 *)((long)(that->sets_)._M_elems + lVar4 + -0x10) = uVar2;
    lVar1 = ((pthread_mutex_t *)((long)this + 0x50))->__align;
    ((pthread_mutex_t *)((long)this + 0x50))->__align =
         *(long *)((long)&(that->sets_)._M_elems[0].set_.ctrl_ + lVar4);
    *(long *)((long)&(that->sets_)._M_elems[0].set_.ctrl_ + lVar4) = lVar1;
    pthread_mutex_unlock((pthread_mutex_t *)this);
    lVar4 = lVar4 + 0x30;
    this = (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
            *)((long)this + 0x58);
  } while (lVar4 != 0x328);
  return;
}

Assistant:

void swap(parallel_hash_set<N, RefSet, Mtx2_, Policy, Hash, Eq, Alloc>& that)
        noexcept(IsNoThrowSwappable<EmbeddedSet>() &&
                 (!AllocTraits::propagate_on_container_swap::value ||
                  IsNoThrowSwappable<allocator_type>(typename AllocTraits::propagate_on_container_swap{})))
    {
        using std::swap;
        using Lockable2 = phmap::LockableImpl<Mtx2_>;
         
        for (size_t i=0; i<num_tables; ++i)
        {
            typename Lockable::UniqueLock l(sets_[i]);
            typename Lockable2::UniqueLock l2(that.get_inner(i));
            swap(sets_[i].set_, that.get_inner(i).set_);
        }
    }